

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_array.c
# Opt level: O2

void d_array_setup(void)

{
  undefined8 in_RAX;
  uint uVar3;
  t_symbol *ptVar1;
  _class *p_Var2;
  ulong uVar4;
  
  uVar3 = (uint)((ulong)in_RAX >> 0x20);
  ptVar1 = gensym("tabwrite~");
  uVar4 = (ulong)uVar3 << 0x20;
  tabwrite_tilde_class = class_new(ptVar1,tabwrite_tilde_new,(t_method)0x0,0x50,0,A_DEFSYM,uVar4);
  class_domainsignalin(tabwrite_tilde_class,0x48);
  p_Var2 = tabwrite_tilde_class;
  ptVar1 = gensym("dsp");
  class_addmethod(p_Var2,tabwrite_tilde_dsp,ptVar1,A_CANT);
  p_Var2 = tabwrite_tilde_class;
  ptVar1 = gensym("set");
  class_addmethod(p_Var2,tabwrite_tilde_set,ptVar1,A_SYMBOL);
  p_Var2 = tabwrite_tilde_class;
  ptVar1 = gensym("stop");
  class_addmethod(p_Var2,tabwrite_tilde_stop,ptVar1,A_NULL);
  p_Var2 = tabwrite_tilde_class;
  ptVar1 = gensym("start");
  class_addmethod(p_Var2,tabwrite_tilde_start,ptVar1,A_DEFFLOAT);
  class_addbang(tabwrite_tilde_class,tabwrite_tilde_bang);
  ptVar1 = gensym("tabplay~");
  uVar4 = uVar4 & 0xffffffff00000000;
  p_Var2 = class_new(ptVar1,tabplay_tilde_new,tabplay_tilde_free,0x60,0,A_DEFSYM,uVar4);
  tabplay_tilde_class = p_Var2;
  ptVar1 = gensym("dsp");
  class_addmethod(p_Var2,tabplay_tilde_dsp,ptVar1,A_CANT);
  p_Var2 = tabplay_tilde_class;
  ptVar1 = gensym("stop");
  class_addmethod(p_Var2,tabplay_tilde_stop,ptVar1,A_NULL);
  p_Var2 = tabplay_tilde_class;
  ptVar1 = gensym("set");
  class_addmethod(p_Var2,tabplay_tilde_set,ptVar1,A_DEFSYM);
  class_addlist(tabplay_tilde_class,tabplay_tilde_list);
  ptVar1 = gensym("tabread~");
  uVar4 = uVar4 & 0xffffffff00000000;
  tabread_tilde_class = class_new(ptVar1,tabread_tilde_new,tabread_tilde_free,0x50,0,A_DEFSYM,uVar4)
  ;
  class_domainsignalin(tabread_tilde_class,0x48);
  p_Var2 = tabread_tilde_class;
  ptVar1 = gensym("dsp");
  class_addmethod(p_Var2,tabread_tilde_dsp,ptVar1,A_CANT);
  p_Var2 = tabread_tilde_class;
  ptVar1 = gensym("set");
  class_addmethod(p_Var2,tabread_tilde_set,ptVar1,A_SYMBOL);
  ptVar1 = gensym("tabread4~");
  uVar4 = uVar4 & 0xffffffff00000000;
  tabread4_tilde_class =
       class_new(ptVar1,tabread4_tilde_new,tabread4_tilde_free,0x50,0,A_DEFSYM,uVar4);
  class_domainsignalin(tabread4_tilde_class,0x48);
  p_Var2 = tabread4_tilde_class;
  ptVar1 = gensym("dsp");
  class_addmethod(p_Var2,tabread4_tilde_dsp,ptVar1,A_CANT);
  p_Var2 = tabread4_tilde_class;
  ptVar1 = gensym("set");
  class_addmethod(p_Var2,tabread4_tilde_set,ptVar1,A_SYMBOL);
  ptVar1 = gensym("tabosc4~");
  uVar4 = uVar4 & 0xffffffff00000000;
  tabosc4_tilde_class = class_new(ptVar1,tabosc4_tilde_new,(t_method)0x0,0x60,0,A_DEFSYM,uVar4);
  class_domainsignalin(tabosc4_tilde_class,0x48);
  p_Var2 = tabosc4_tilde_class;
  ptVar1 = gensym("dsp");
  class_addmethod(p_Var2,tabosc4_tilde_dsp,ptVar1,A_CANT);
  p_Var2 = tabosc4_tilde_class;
  ptVar1 = gensym("set");
  class_addmethod(p_Var2,tabosc4_tilde_set,ptVar1,A_SYMBOL);
  p_Var2 = tabosc4_tilde_class;
  ptVar1 = gensym("ft1");
  class_addmethod(p_Var2,tabosc4_tilde_ft1,ptVar1,A_FLOAT);
  ptVar1 = gensym("tabsend~");
  uVar4 = uVar4 & 0xffffffff00000000;
  tabsend_class = class_new(ptVar1,tabsend_new,(t_method)0x0,0x50,0,A_DEFSYM,uVar4);
  class_domainsignalin(tabsend_class,0x48);
  p_Var2 = tabsend_class;
  ptVar1 = gensym("dsp");
  class_addmethod(p_Var2,tabsend_dsp,ptVar1,A_CANT);
  p_Var2 = tabsend_class;
  ptVar1 = gensym("set");
  class_addmethod(p_Var2,tabsend_set,ptVar1,A_SYMBOL);
  p_Var2 = tabsend_class;
  ptVar1 = gensym("tabsend-receive~");
  class_sethelpsymbol(p_Var2,ptVar1);
  ptVar1 = gensym("tabreceive~");
  uVar4 = uVar4 & 0xffffffff00000000;
  p_Var2 = class_new(ptVar1,tabreceive_new,(t_method)0x0,0x48,0,A_DEFSYM,uVar4);
  tabreceive_class = p_Var2;
  ptVar1 = gensym("dsp");
  class_addmethod(p_Var2,tabreceive_dsp,ptVar1,A_CANT);
  p_Var2 = tabreceive_class;
  ptVar1 = gensym("set");
  class_addmethod(p_Var2,tabreceive_set,ptVar1,A_SYMBOL);
  p_Var2 = tabreceive_class;
  ptVar1 = gensym("tabsend-receive~");
  class_sethelpsymbol(p_Var2,ptVar1);
  ptVar1 = gensym("tabread");
  uVar4 = uVar4 & 0xffffffff00000000;
  tabread_class = class_new(ptVar1,tabread_new,(t_method)0x0,0x38,0,A_DEFSYM,uVar4);
  class_doaddfloat(tabread_class,tabread_float);
  p_Var2 = tabread_class;
  ptVar1 = gensym("set");
  class_addmethod(p_Var2,tabread_set,ptVar1,A_SYMBOL);
  ptVar1 = gensym("tabread4");
  tabread4_class =
       class_new(ptVar1,tabread4_new,(t_method)0x0,0x38,0,A_DEFSYM,uVar4 & 0xffffffff00000000);
  class_doaddfloat(tabread4_class,tabread4_float);
  p_Var2 = tabread4_class;
  ptVar1 = gensym("set");
  class_addmethod(p_Var2,tabread4_set,ptVar1,A_SYMBOL,0);
  tabwrite_setup();
  return;
}

Assistant:

static void tabwrite_tilde_setup(void)
{
    tabwrite_tilde_class = class_new(gensym("tabwrite~"),
        (t_newmethod)tabwrite_tilde_new, 0,
        sizeof(t_tabwrite_tilde), 0, A_DEFSYM, 0);
    CLASS_MAINSIGNALIN(tabwrite_tilde_class, t_tabwrite_tilde, x_f);
    class_addmethod(tabwrite_tilde_class, (t_method)tabwrite_tilde_dsp,
        gensym("dsp"), A_CANT, 0);
    class_addmethod(tabwrite_tilde_class, (t_method)tabwrite_tilde_set,
        gensym("set"), A_SYMBOL, 0);
    class_addmethod(tabwrite_tilde_class, (t_method)tabwrite_tilde_stop,
        gensym("stop"), 0);
    class_addmethod(tabwrite_tilde_class, (t_method)tabwrite_tilde_start,
        gensym("start"), A_DEFFLOAT, 0);
    class_addbang(tabwrite_tilde_class, tabwrite_tilde_bang);
}